

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

iterator __thiscall Map::DelItem(Map *this,iterator it,Character *from)

{
  Character *this_00;
  bool bVar1;
  __shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  reference ppCVar4;
  const_iterator local_90;
  Character *local_88;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  undefined1 local_58 [8];
  PacketBuilder builder;
  Character *from_local;
  Map *this_local;
  iterator it_local;
  
  builder.add_size = (size_t)from;
  this_local = (Map *)it._M_node;
  PacketBuilder::PacketBuilder((PacketBuilder *)local_58,PACKET_ITEM,PACKET_REMOVE,2);
  p_Var2 = (__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*
                     ((_List_iterator<std::shared_ptr<Map_Item>_> *)&this_local);
  peVar3 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var2);
  PacketBuilder::AddShort((PacketBuilder *)local_58,(int)peVar3->uid);
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&character), bVar1) {
    ppCVar4 = std::_List_iterator<Character_*>::operator*(&__end1);
    this_00 = *ppCVar4;
    local_88 = this_00;
    if ((builder.add_size == 0) || (this_00 != (Character *)builder.add_size)) {
      p_Var2 = (__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*
                         ((_List_iterator<std::shared_ptr<Map_Item>_> *)&this_local);
      peVar3 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*(p_Var2);
      bVar1 = Character::InRange(this_00,peVar3);
      if (bVar1) {
        Character::Send(local_88,(PacketBuilder *)local_58);
      }
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  std::_List_const_iterator<std::shared_ptr<Map_Item>_>::_List_const_iterator
            (&local_90,(iterator *)&this_local);
  it_local = std::__cxx11::
             list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::erase
                       (&this->items,local_90);
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_58);
  return (iterator)it_local._M_node;
}

Assistant:

std::list<std::shared_ptr<Map_Item>>::iterator Map::DelItem(std::list<std::shared_ptr<Map_Item>>::iterator it, Character *from)
{
	PacketBuilder builder(PACKET_ITEM, PACKET_REMOVE, 2);
	builder.AddShort((*it)->uid);

	UTIL_FOREACH(this->characters, character)
	{
		if ((from && character == from) || !character->InRange(**it))
		{
			continue;
		}

		character->Send(builder);
	}

	return this->items.erase(it);
}